

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

char * absl::anon_unknown_0::EncodeTenThousand(uint32_t n,Nonnull<char_*> out_str)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long in_RSI;
  uint in_EDI;
  uint32_t zeroes;
  uint32_t tens;
  uint32_t hundreds;
  uint32_t mod100;
  uint32_t div100;
  
  uVar1 = in_EDI * 0x10000 + (int)((ulong)in_EDI * 0x28f6 >> 0x14) * -0x63ffff;
  uVar2 = (uint)((ulong)uVar1 * 0x67 >> 10) & 0xf000f;
  uVar2 = uVar2 + (uVar1 + uVar2 * -10) * 0x100;
  if (uVar2 != 0) {
    uVar3 = countr_zero<unsigned_int>(uVar2);
    uVar3 = uVar3 & 0xfffffff8;
    little_endian::Store32
              ((Nonnull<void_*>)CONCAT44(uVar1,uVar2 + 0x30303030 >> ((byte)uVar3 & 0x1f)),uVar3);
    return (char *)((in_RSI + 4) - (ulong)(uVar3 >> 3));
  }
  __assert_fail("tens != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                ,0xc0,
                "char *absl::(anonymous namespace)::EncodeTenThousand(uint32_t, absl::Nonnull<char *>)"
               );
}

Assistant:

inline char* EncodeTenThousand(uint32_t n, absl::Nonnull<char*> out_str) {
  // We split lower 2 digits and upper 2 digits of n into 2 byte consecutive
  // blocks. 123 ->  [\0\1][\0\23]. We divide by 10 both blocks
  // (it's 1 division + zeroing upper bits), and compute modulo 10 as well "in
  // parallel". Then we combine both results to have both ASCII digits,
  // strip trailing zeros, add ASCII '0000' and return.
  uint32_t div100 = (n * kDivisionBy100Mul) / kDivisionBy100Div;
  uint32_t mod100 = n - 100ull * div100;
  uint32_t hundreds = (mod100 << 16) + div100;
  uint32_t tens = (hundreds * kDivisionBy10Mul) / kDivisionBy10Div;
  tens &= (0xFull << 16) | 0xFull;
  tens += (hundreds - 10ull * tens) << 8;
  ABSL_ASSUME(tens != 0);
  // The result can contain trailing zero bits, we need to strip them to a first
  // significant byte in a final representation. For example, for n = 123, we
  // have tens to have representation \0\1\2\3. We do `& -8` to round
  // to a multiple to 8 to strip zero bytes, not all zero bits.
  // countr_zero to help.
  // 0 minus 8 to make MSVC happy.
  uint32_t zeroes = static_cast<uint32_t>(absl::countr_zero(tens)) & (0 - 8u);
  tens += kFourZeroBytes;
  tens >>= zeroes;
  little_endian::Store32(out_str, tens);
  return out_str + sizeof(tens) - zeroes / 8;
}